

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_unlink_internal(lyd_node *node,int permanent)

{
  lyd_node *local_28;
  lyd_node *iter;
  int permanent_local;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_unlink_internal");
    node_local._4_4_ = 1;
  }
  else {
    if (permanent != 0) {
      check_leaf_list_backlinks(node,1);
    }
    if (node->prev->next != (lyd_node *)0x0) {
      node->prev->next = node->next;
    }
    if (node->next == (lyd_node *)0x0) {
      if (node->parent == (lyd_node *)0x0) {
        for (local_28 = node->prev; local_28->prev != node; local_28 = local_28->prev) {
        }
      }
      else {
        local_28 = node->parent->child;
      }
      local_28->prev = node->prev;
    }
    else {
      node->next->prev = node->prev;
    }
    if (node->parent != (lyd_node *)0x0) {
      if (node->parent->child == node) {
        node->parent->child = node->next;
      }
      if (permanent != 2) {
        lyd_unlink_hash(node,node->parent);
      }
      node->parent = (lyd_node *)0x0;
    }
    node->next = (lyd_node *)0x0;
    node->prev = node;
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

int
lyd_unlink_internal(struct lyd_node *node, int permanent)
{
    struct lyd_node *iter;

    if (!node) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (permanent) {
        check_leaf_list_backlinks(node, 1);
    }

    /* unlink from siblings */
    if (node->prev->next) {
        node->prev->next = node->next;
    }
    if (node->next) {
        node->next->prev = node->prev;
    } else {
        /* unlinking the last node */
        if (node->parent) {
            iter = node->parent->child;
        } else {
            iter = node->prev;
            while (iter->prev != node) {
                iter = iter->prev;
            }
        }
        /* update the "last" pointer from the first node */
        iter->prev = node->prev;
    }

    /* unlink from parent */
    if (node->parent) {
        if (node->parent->child == node) {
            /* the node is the first child */
            node->parent->child = node->next;
        }

#ifdef LY_ENABLED_CACHE
        /* do not remove from parent hash table if freeing the whole subtree */
        if (permanent != 2) {
            lyd_unlink_hash(node, node->parent);
        }
#endif

        node->parent = NULL;
    }

    node->next = NULL;
    node->prev = node;

    return EXIT_SUCCESS;
}